

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesCMakeSystemVariable(cmFindPackageCommand *this)

{
  long lVar1;
  bool bVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  mapped_type *this_00;
  cmValue cVar7;
  string *psVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path;
  pointer __lhs;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string debugBuffer;
  cmList expanded;
  long install_prefix_count;
  string install_path_to_remove;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeSystem);
  pcVar3 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&install_path_to_remove,"CMAKE_FIND_NO_INSTALL_PREFIX",
             (allocator<char> *)&debugBuffer);
  bVar4 = cmMakefile::IsOn(pcVar3,&install_path_to_remove);
  std::__cxx11::string::~string((string *)&install_path_to_remove);
  bVar2 = (this->super_cmFindCommon).NoCMakeInstallPath;
  if (bVar2 == false) {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&install_path_to_remove,"CMAKE_FIND_USE_INSTALL_PREFIX",
               (allocator<char> *)&debugBuffer);
    bVar5 = cmMakefile::IsDefinitionSet(pcVar3,&install_path_to_remove);
    std::__cxx11::string::~string((string *)&install_path_to_remove);
  }
  else {
    bVar5 = false;
  }
  install_prefix_count = -1;
  install_path_to_remove._M_dataplus._M_p = (pointer)&install_path_to_remove.field_2;
  install_path_to_remove._M_string_length = 0;
  install_path_to_remove.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugBuffer,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT",
             (allocator<char> *)&expanded);
  cVar7 = cmMakefile::GetDefinition(pcVar3,&debugBuffer);
  std::__cxx11::string::~string((string *)&debugBuffer);
  if (cVar7.Value != (string *)0x0) {
    cmStrToLong(cVar7.Value,&install_prefix_count);
  }
  pcVar3 = (this->super_cmFindCommon).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugBuffer,"_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE",
             (allocator<char> *)&expanded);
  cVar7 = cmMakefile::GetDefinition(pcVar3,&debugBuffer);
  std::__cxx11::string::~string((string *)&debugBuffer);
  if (cVar7.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&install_path_to_remove);
  }
  if (((bVar2 == false) || (install_prefix_count < 1 || bVar4)) ||
     (install_path_to_remove._M_string_length == 0)) {
    if ((bVar4 & bVar5) == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&debugBuffer,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&expanded);
      cmSearchPath::AddCMakePath(this_00,&debugBuffer);
      std::__cxx11::string::~string((string *)&debugBuffer);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&debugBuffer,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&expanded);
      cmSearchPath::AddCMakePath(this_00,&debugBuffer);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&debugBuffer,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&expanded);
      cmSearchPath::AddCMakePath(this_00,&debugBuffer);
    }
    std::__cxx11::string::~string((string *)&debugBuffer);
  }
  else {
    pcVar3 = (this->super_cmFindCommon).Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&debugBuffer,"CMAKE_SYSTEM_PREFIX_PATH",(allocator<char> *)&expanded);
    psVar8 = (string *)cmMakefile::GetDefinition(pcVar3,&debugBuffer);
    std::__cxx11::string::~string((string *)&debugBuffer);
    if (psVar8 == (string *)0x0) {
      psVar8 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&debugBuffer,(string *)psVar8);
    init._M_len = 1;
    init._M_array = &debugBuffer;
    cmList::cmList(&expanded,init);
    std::__cxx11::string::~string((string *)&debugBuffer);
    lVar9 = 0;
    for (__lhs = expanded.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != expanded.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var6 = std::operator==(__lhs,&install_path_to_remove);
      lVar1 = lVar9 + 1;
      if ((!_Var6) || (lVar9 = lVar1, lVar1 != install_prefix_count)) {
        cmSearchPath::AddPath(this_00,__lhs);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&expanded.Values);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugBuffer,"CMAKE_SYSTEM_FRAMEWORK_PATH",(allocator<char> *)&expanded);
  cmSearchPath::AddCMakePath(this_00,&debugBuffer);
  std::__cxx11::string::~string((string *)&debugBuffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugBuffer,"CMAKE_SYSTEM_APPBUNDLE_PATH",(allocator<char> *)&expanded);
  cmSearchPath::AddCMakePath(this_00,&debugBuffer);
  std::__cxx11::string::~string((string *)&debugBuffer);
  if ((this->super_cmFindCommon).DebugMode == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&debugBuffer,
               "CMake variables defined in the Platform file [CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n",
               (allocator<char> *)&expanded);
    anon_unknown.dwarf_485276::collectPathsForDebug(&debugBuffer,this_00,0);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>
              ((string *)&expanded,&this->DebugBuffer,&debugBuffer);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&expanded);
    std::__cxx11::string::~string((string *)&expanded);
    std::__cxx11::string::~string((string *)&debugBuffer);
  }
  std::__cxx11::string::~string((string *)&install_path_to_remove);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeSystemVariable()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeSystem];

  const bool install_prefix_in_list =
    !this->Makefile->IsOn("CMAKE_FIND_NO_INSTALL_PREFIX");
  const bool remove_install_prefix = this->NoCMakeInstallPath;
  const bool add_install_prefix = !this->NoCMakeInstallPath &&
    this->Makefile->IsDefinitionSet("CMAKE_FIND_USE_INSTALL_PREFIX");

  // We have 3 possible states for `CMAKE_SYSTEM_PREFIX_PATH` and
  // `CMAKE_INSTALL_PREFIX`.
  // Either we need to remove `CMAKE_INSTALL_PREFIX`, add
  // `CMAKE_INSTALL_PREFIX`, or do nothing.
  //
  // When we need to remove `CMAKE_INSTALL_PREFIX` we remove the Nth occurrence
  // of `CMAKE_INSTALL_PREFIX` from `CMAKE_SYSTEM_PREFIX_PATH`, where `N` is
  // computed by `CMakeSystemSpecificInformation.cmake` while constructing
  // `CMAKE_SYSTEM_PREFIX_PATH`. This ensures that if projects / toolchains
  // have removed `CMAKE_INSTALL_PREFIX` from the list, we don't remove
  // some other entry by mistake
  long install_prefix_count = -1;
  std::string install_path_to_remove;
  if (cmValue to_skip = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_COUNT")) {
    cmStrToLong(*to_skip, &install_prefix_count);
  }
  if (cmValue install_value = this->Makefile->GetDefinition(
        "_CMAKE_SYSTEM_PREFIX_PATH_INSTALL_PREFIX_VALUE")) {
    install_path_to_remove = *install_value;
  }

  if (remove_install_prefix && install_prefix_in_list &&
      install_prefix_count > 0 && !install_path_to_remove.empty()) {

    cmValue prefix_paths =
      this->Makefile->GetDefinition("CMAKE_SYSTEM_PREFIX_PATH");
    // remove entry from CMAKE_SYSTEM_PREFIX_PATH
    cmList expanded{ *prefix_paths };
    long count = 0;
    for (const auto& path : expanded) {
      bool const to_add =
        !(path == install_path_to_remove && ++count == install_prefix_count);
      if (to_add) {
        paths.AddPath(path);
      }
    }
  } else if (add_install_prefix && !install_prefix_in_list) {
    paths.AddCMakePath("CMAKE_INSTALL_PREFIX");
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  } else {
    // Otherwise the current setup of `CMAKE_SYSTEM_PREFIX_PATH` is correct
    paths.AddCMakePath("CMAKE_SYSTEM_PREFIX_PATH");
  }

  paths.AddCMakePath("CMAKE_SYSTEM_FRAMEWORK_PATH");
  paths.AddCMakePath("CMAKE_SYSTEM_APPBUNDLE_PATH");

  if (this->DebugMode) {
    std::string debugBuffer = "CMake variables defined in the Platform file "
                              "[CMAKE_FIND_USE_CMAKE_SYSTEM_PATH].\n";
    collectPathsForDebug(debugBuffer, paths);
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }
}